

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

APlayerPawn * P_SpawnPlayer(FPlayerStart *mthing,int playernum,int flags)

{
  double *pdVar1;
  char cVar2;
  APlayerPawn *oldplayer;
  FPlayerSkin *pFVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  DWORD DVar7;
  player_t *this;
  FPlayerClass *pFVar8;
  AActor *pAVar9;
  TAngle<double> *pTVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  int local_e8;
  int local_e4;
  int ii_1;
  int i;
  TThinkerIterator<AActor> it;
  AActor *th;
  DVector3 local_b8;
  AInventory *local_a0;
  APowerup *invul;
  TFlags<ActorFlag4,_unsigned_int> local_90;
  int ii;
  TFlags<ActorFlag2,_unsigned_int> local_88;
  TFlags<ActorFlag,_unsigned_int> local_84;
  DVector3 local_80;
  uint local_64;
  int type;
  DAngle SpawnAngle;
  DVector3 spawn;
  BYTE state;
  APlayerPawn *oldactor;
  APlayerPawn *mobj;
  player_t *p;
  int flags_local;
  int playernum_local;
  FPlayerStart *mthing_local;
  
  TVector3<double>::TVector3((TVector3<double> *)&SpawnAngle);
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffa0);
  if (mthing == (FPlayerStart *)0x0) {
    mthing_local = (FPlayerStart *)0x0;
  }
  else if (((uint)playernum < 8) && ((playeringame[playernum] & 1U) != 0)) {
    if (playernum == consoleplayer) {
      P_PredictionLerpReset();
    }
    lVar11 = (long)playernum;
    lVar12 = lVar11 * 0x2a0;
    this = (player_t *)(&players + lVar11 * 0x54);
    if (*(long *)(&DAT_01ae7110 + lVar12) == 0) {
      uVar5 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
      if (uVar5 < 2) {
        (&DAT_01ae7160)[lVar12] = 0;
      }
      else {
        iVar6 = FIntCVar::operator_cast_to_int(&deathmatch);
        if ((iVar6 == 0) || ((multiplayer & 1U) == 0)) {
          local_64 = SinglePlayerClass[playernum];
        }
        else {
          local_64 = userinfo_t::GetPlayerClassNum((userinfo_t *)(lVar12 + 0x1ae70f8));
          if ((int)local_64 < 0) {
            uVar5 = FRandom::operator()(&pr_multiclasschoice);
            local_64 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
            local_64 = uVar5 % local_64;
          }
        }
        (&DAT_01ae7160)[lVar12] = (char)local_64;
      }
      pFVar8 = TArray<FPlayerClass,_FPlayerClass>::operator[]
                         (&PlayerClasses,(ulong)(byte)(&DAT_01ae7160)[lVar12]);
      *(PClassPlayerPawn **)(&DAT_01ae7110 + lVar12) = pFVar8->Type;
    }
    uVar5 = FIntCVar::operator_cast_to_int(&dmflags2);
    if (((((((uVar5 & 0x1000) == 0) || ((&DAT_01ae70c8)[lVar12] != '\x02')) ||
          (iVar6 = FIntCVar::operator_cast_to_int(&deathmatch), iVar6 != 0)) ||
         ((gameaction == ga_worlddone || (this->mo == (APlayerPawn *)0x0)))) ||
        ((((this->mo->super_AActor).Sector)->Flags & 8) != 0)) ||
       ((pAVar9 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)(&DAT_01ae71f0 + lVar12)),
        pAVar9 == (AActor *)0x0 || (999999 < ((this->mo->super_AActor).Sector)->damageamount)))) {
      SpawnAngle.Degrees = (mthing->pos).X;
      TAngle<double>::operator=
                ((TAngle<double> *)&stack0xffffffffffffffa0,(double)(int)mthing->angle);
      if ((i_compatflags2 & 1U) != 0) {
        TAngle<double>::operator+=((TAngle<double> *)&stack0xffffffffffffffa0,0.01);
      }
      pAVar9 = GetDefaultByType(*(PClass **)(&DAT_01ae7110 + lVar12));
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_84,
                 (int)pAVar9 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_84);
      if (uVar5 == 0) {
        pAVar9 = GetDefaultByType(*(PClass **)(&DAT_01ae7110 + lVar12));
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_88,(int)pAVar9 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_88);
        if (uVar5 == 0) {
          spawn.Y = -2147483648.0;
        }
        else {
          spawn.Y = 2147483646.0;
        }
      }
      else {
        spawn.Y = 2147483647.0;
      }
    }
    else {
      AActor::Pos(&local_80,&this->mo->super_AActor);
      TVector3<double>::operator=((TVector3<double> *)&SpawnAngle,&local_80);
      TAngle<double>::operator=
                ((TAngle<double> *)&stack0xffffffffffffffa0,&(this->mo->super_AActor).Angles.Yaw);
    }
    mthing_local = (FPlayerStart *)
                   Spawn(*(PClassActor **)(&DAT_01ae7110 + lVar12),(DVector3 *)&SpawnAngle,
                         NO_REPLACE);
    if ((level.flags & 0x8000000) != 0) {
      if ((spawn.Y != -2147483648.0) || (NAN(spawn.Y))) {
        if ((spawn.Y == 2147483647.0) && (!NAN(spawn.Y))) {
          AActor::AddZ((AActor *)mthing_local,-(mthing->pos).Z,true);
        }
      }
      else {
        AActor::AddZ((AActor *)mthing_local,(mthing->pos).Z,true);
      }
      P_FindFloorCeiling((AActor *)mthing_local,0xe);
    }
    (((APlayerPawn *)mthing_local)->super_AActor).FriendPlayer = (char)playernum + '\x01';
    oldplayer = this->mo;
    this->mo = (APlayerPawn *)mthing_local;
    (((APlayerPawn *)mthing_local)->super_AActor).player = this;
    cVar2 = (&DAT_01ae70c8)[lVar12];
    if ((cVar2 == '\x02') || (cVar2 == '\x03')) {
      G_PlayerReborn(playernum);
    }
    else if (((oldplayer != (APlayerPawn *)0x0) && ((oldplayer->super_AActor).player == this)) &&
            ((flags & 1U) == 0)) {
      AActor::ObtainInventory((AActor *)mthing_local,&oldplayer->super_AActor);
      FBehavior::StaticStopMyScripts(&oldplayer->super_AActor);
    }
    pFVar3 = skins;
    iVar6 = userinfo_t::GetSkin((userinfo_t *)(lVar12 + 0x1ae70f8));
    iVar6 = R_FindSkin(pFVar3[iVar6].name,(uint)(byte)(&DAT_01ae7160)[lVar12]);
    userinfo_t::SkinNumChanged((userinfo_t *)(lVar12 + 0x1ae70f8),iVar6);
    TFlags<ActorFlag2,_unsigned_int>::operator&
              ((TFlags<ActorFlag2,_unsigned_int> *)&ii,
               (int)mthing_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&ii);
    if (uVar5 == 0) {
      R_BuildPlayerTranslation(playernum);
      DVar7 = TRANSLATION('\x01',playernum);
      (((APlayerPawn *)mthing_local)->super_AActor).Translation = DVar7;
    }
    TAngle<double>::operator=
              (&(((APlayerPawn *)mthing_local)->super_AActor).Angles.Yaw,
               (TAngle<double> *)&stack0xffffffffffffffa0);
    pTVar10 = TAngle<double>::operator=
                        (&(((APlayerPawn *)mthing_local)->super_AActor).Angles.Roll,0.0);
    TAngle<double>::operator=(&(((APlayerPawn *)mthing_local)->super_AActor).Angles.Pitch,pTVar10);
    (((APlayerPawn *)mthing_local)->super_AActor).health = (&DAT_01ae7158)[lVar11 * 0xa8];
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_90,
               (int)mthing_local +
               (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_90);
    pFVar3 = skins;
    if (uVar5 == 0) {
      iVar6 = userinfo_t::GetSkin((userinfo_t *)(lVar12 + 0x1ae70f8));
      (((APlayerPawn *)mthing_local)->super_AActor).sprite = pFVar3[iVar6].sprite;
    }
    *(undefined4 *)(&DAT_01ae711c + lVar12) = 0x42b40000;
    *(undefined4 *)(&DAT_01ae7118 + lVar12) = 0x42b40000;
    TObjPtr<AActor>::operator=((TObjPtr<AActor> *)(&DAT_01ae7238 + lVar12),&this->mo->super_AActor);
    (&DAT_01ae70c8)[lVar12] = 0;
    *(undefined2 *)(&DAT_01ae71b0 + lVar12) = 0;
    *(undefined4 *)(&DAT_01ae71c4 + lVar12) = 0;
    *(undefined4 *)(&DAT_01ae71c8 + lVar12) = 0;
    *(undefined4 *)(&DAT_01ae7200 + lVar12) = 0;
    *(undefined8 *)(&DAT_01ae7208 + lVar12) = 0;
    *(undefined4 *)(&DAT_01ae7210 + lVar12) = 0;
    *(undefined8 *)(&DAT_01ae7218 + lVar12) = 0;
    *(undefined4 *)(&DAT_01ae71f8 + lVar12) = 0;
    *(undefined2 *)(&DAT_01ae71fc + lVar12) = 0xffff;
    *(undefined2 *)(&DAT_01ae71fe + lVar12) = 0xffff;
    *(double *)(&DAT_01ae7128 + lVar12) = ((APlayerPawn *)mthing_local)->ViewHeight;
    *(undefined2 *)(&DAT_01ae71b2 + lVar12) = 0;
    TObjPtr<AActor>::operator=((TObjPtr<AActor> *)(&DAT_01ae71f0 + lVar12),(AActor *)0x0);
    (&DAT_01ae718d)[lVar12] = 0;
    (&DAT_01ae718c)[lVar12] = 0;
    *(undefined4 *)(&DAT_01ae7188 + lVar12) = 0;
    *(undefined4 *)(&DAT_01ae726c + lVar12) = 0;
    *(undefined4 *)(&DAT_01ae7268 + lVar12) = 0;
    *(undefined4 *)(&DAT_01ae7264 + lVar12) = 0;
    *(undefined4 *)(&DAT_01ae7260 + lVar12) = 0;
    APlayerPawn::ResetAirSupply(this->mo,false);
    player_t::Uncrouch(this);
    pTVar10 = TAngle<double>::operator=((TAngle<double> *)(lVar12 + 0x1ae7280),0.0);
    TAngle<double>::operator=((TAngle<double> *)(lVar12 + 0x1ae7278),pTVar10);
    TObjPtr<AActor>::operator=((TObjPtr<AActor> *)(lVar12 + 0x1ae7248),(AActor *)0x0);
    (&DAT_01ae7250)[lVar12] = 0xff;
    TVector2<double>::Zero((TVector2<double> *)(lVar12 + 0x1ae7140));
    for (invul._4_4_ = 0; invul._4_4_ < 8; invul._4_4_ = invul._4_4_ + 1) {
      if (((playeringame[invul._4_4_] & 1U) != 0) &&
         (bVar4 = TObjPtr<AActor>::operator==
                            ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)invul._4_4_ * 0x2a0),
                             &oldplayer->super_AActor), bVar4)) {
        TObjPtr<AActor>::operator=
                  ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)invul._4_4_ * 0x2a0),
                   (AActor *)mthing_local);
      }
    }
    if ((((demoplayback & 1U) != 0) || ((demonew & 1U) != 0)) &&
       (bVar4 = FBoolCVar::operator_cast_to_bool(&chasedemo), bVar4)) {
      *(undefined4 *)(&DAT_01ae71a8 + lVar12) = 0x20;
    }
    if ((flags & 1U) == 0) {
      P_SetupPsprites(this,(flags & 2U) != 0);
    }
    iVar6 = FIntCVar::operator_cast_to_int(&deathmatch);
    if (iVar6 == 0) {
      if (((((multiplayer & 1U) != 0) || ((level.flags2 & 0x20000) != 0)) ||
          (bVar4 = FBoolCVar::operator_cast_to_bool(&sv_singleplayerrespawn), bVar4)) &&
         ((cVar2 == '\x02' && (oldplayer != (APlayerPawn *)0x0)))) {
        APlayerPawn::FilterCoopRespawnInventory(this->mo,oldplayer);
      }
    }
    else {
      APlayerPawn::GiveDeathmatchInventory(this->mo);
    }
    if (oldplayer != (APlayerPawn *)0x0) {
      AActor::DestroyAllInventory(&oldplayer->super_AActor);
    }
    if (((cVar2 == '\x02') || (cVar2 == '\x03')) &&
       ((uVar5 = FIntCVar::operator_cast_to_int(&dmflags2), (uVar5 & 0x400) != 0 &&
        (((multiplayer & 1U) != 0 ||
         (bVar4 = FBoolCVar::operator_cast_to_bool(&alwaysapplydmflags), bVar4)))))) {
      local_a0 = AActor::GiveInventoryType
                           (&this->mo->super_AActor,
                            (PClassActor *)APowerInvulnerable::RegistrationInfo.MyClass);
      *(undefined4 *)&local_a0->field_0x4fc = 0x69;
      PalEntry::operator=((PalEntry *)(local_a0 + 1),0);
      local_a0->ItemFlags = local_a0->ItemFlags | 0x20;
      (this->mo->super_AActor).effects = (this->mo->super_AActor).effects | 0x20;
    }
    if ((StatusBar != (DBaseStatusBar *)0x0) &&
       ((playernum == consoleplayer ||
        (iVar6 = DBaseStatusBar::GetPlayer(StatusBar), iVar6 == playernum)))) {
      (*(StatusBar->super_DObject)._vptr_DObject[10])();
    }
    if ((multiplayer & 1U) != 0) {
      TAngle<double>::TAngle
                ((TAngle<double> *)&th,&(((APlayerPawn *)mthing_local)->super_AActor).Angles.Yaw);
      AActor::Vec3Angle(&local_b8,(AActor *)mthing_local,20.0,(DAngle *)&th,0.0,false);
      P_SpawnTeleportFog((AActor *)mthing_local,&local_b8,false,true);
    }
    dVar13 = AActor::Top((AActor *)mthing_local);
    pdVar1 = &(((APlayerPawn *)mthing_local)->super_AActor).ceilingz;
    if (*pdVar1 <= dVar13 && dVar13 != *pdVar1) {
      AActor::SetZ((AActor *)mthing_local,
                   (((APlayerPawn *)mthing_local)->super_AActor).ceilingz -
                   (((APlayerPawn *)mthing_local)->super_AActor).Height,false);
    }
    if ((flags & 1U) == 0) {
      if ((cVar2 == '\x03') || ((cVar2 == '\0' && ((savegamerestore & 1U) == 0)))) {
        FBehavior::StaticStartTypedScripts(4,&this->mo->super_AActor,true,0,false);
      }
      else if (cVar2 == '\x02') {
        if (oldplayer == (APlayerPawn *)0x0) {
          __assert_fail("oldactor != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x147a,"APlayerPawn *P_SpawnPlayer(FPlayerStart *, int, int)");
        }
        TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&ii_1,0x80);
        while (it.super_FThinkerIterator._16_8_ =
                    TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&ii_1,false),
              (AActor *)it.super_FThinkerIterator._16_8_ != (AActor *)0x0) {
          bVar4 = TObjPtr<AActor>::operator==
                            (&((AActor *)it.super_FThinkerIterator._16_8_)->LastHeard,
                             &oldplayer->super_AActor);
          if (bVar4) {
            TObjPtr<AActor>::operator=
                      ((TObjPtr<AActor> *)(it.super_FThinkerIterator._16_8_ + 0x218),(AActor *)0x0);
          }
        }
        it.super_FThinkerIterator.m_Stat = '\0';
        it.super_FThinkerIterator.m_SearchStats = false;
        it.super_FThinkerIterator.m_SearchingFresh = false;
        it.super_FThinkerIterator._19_5_ = 0;
        for (local_e4 = 0; local_e4 < numsectors; local_e4 = local_e4 + 1) {
          bVar4 = TObjPtr<AActor>::operator==
                            (&sectors[local_e4].SoundTarget,&oldplayer->super_AActor);
          if (bVar4) {
            TObjPtr<AActor>::operator=(&sectors[local_e4].SoundTarget,(AActor *)0x0);
          }
        }
        DObject::StaticPointerSubstitution((DObject *)oldplayer,(DObject *)this->mo,false);
        for (local_e8 = 0; local_e8 < 0x20; local_e8 = local_e8 + 1) {
          if ((APlayerPawn *)bodyque[local_e8] == this->mo) {
            bodyque[local_e8] = &oldplayer->super_AActor;
          }
        }
        FBehavior::StaticStartTypedScripts(2,&this->mo->super_AActor,true,0,false);
      }
    }
  }
  else {
    mthing_local = (FPlayerStart *)0x0;
  }
  return (APlayerPawn *)mthing_local;
}

Assistant:

APlayerPawn *P_SpawnPlayer (FPlayerStart *mthing, int playernum, int flags)
{
	player_t *p;
	APlayerPawn *mobj, *oldactor;
	BYTE	  state;
	DVector3 spawn;
	DAngle SpawnAngle;

	if (mthing == NULL)
	{
		return NULL;
	}
	// not playing?
	if ((unsigned)playernum >= (unsigned)MAXPLAYERS || !playeringame[playernum])
		return NULL;

	// Old lerp data needs to go
	if (playernum == consoleplayer)
	{
		P_PredictionLerpReset();
	}

	p = &players[playernum];

	if (p->cls == NULL)
	{
		// [GRB] Pick a class from player class list
		if (PlayerClasses.Size () > 1)
		{
			int type;

			if (!deathmatch || !multiplayer)
			{
				type = SinglePlayerClass[playernum];
			}
			else
			{
				type = p->userinfo.GetPlayerClassNum();
				if (type < 0)
				{
					type = pr_multiclasschoice() % PlayerClasses.Size ();
				}
			}
			p->CurrentPlayerClass = type;
		}
		else
		{
			p->CurrentPlayerClass = 0;
		}
		p->cls = PlayerClasses[p->CurrentPlayerClass].Type;
	}

	if (( dmflags2 & DF2_SAME_SPAWN_SPOT ) &&
		( p->playerstate == PST_REBORN ) &&
		( deathmatch == false ) &&
		( gameaction != ga_worlddone ) &&
		( p->mo != NULL ) && 
		( !(p->mo->Sector->Flags & SECF_NORESPAWN) ) &&
		( NULL != p->attacker ) &&							// don't respawn on damaging floors
		( p->mo->Sector->damageamount < TELEFRAG_DAMAGE ))	// this really should be a bit smarter...
	{
		spawn = p->mo->Pos();
		SpawnAngle = p->mo->Angles.Yaw;
	}
	else
	{
		spawn.X = mthing->pos.X;
		spawn.Y = mthing->pos.Y;

		// Allow full angular precision
		SpawnAngle = (double)mthing->angle;
		if (i_compatflags2 & COMPATF2_BADANGLES)
		{
			SpawnAngle += 0.01;
		}

		if (GetDefaultByType(p->cls)->flags & MF_SPAWNCEILING)
			spawn.Z = ONCEILINGZ;
		else if (GetDefaultByType(p->cls)->flags2 & MF2_SPAWNFLOAT)
			spawn.Z = FLOATRANDZ;
		else
			spawn.Z = ONFLOORZ;
	}

	mobj = static_cast<APlayerPawn *>
		(Spawn (p->cls, spawn, NO_REPLACE));

	if (level.flags & LEVEL_USEPLAYERSTARTZ)
	{
		if (spawn.Z == ONFLOORZ)
			mobj->AddZ(mthing->pos.Z);
		else if (spawn.Z == ONCEILINGZ)
			mobj->AddZ(-mthing->pos.Z);
		P_FindFloorCeiling(mobj, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	}

	mobj->FriendPlayer = playernum + 1;	// [RH] players are their own friends
	oldactor = p->mo;
	p->mo = mobj;
	mobj->player = p;
	state = p->playerstate;
	if (state == PST_REBORN || state == PST_ENTER)
	{
		G_PlayerReborn (playernum);
	}
	else if (oldactor != NULL && oldactor->player == p && !(flags & SPF_TEMPPLAYER))
	{
		// Move the voodoo doll's inventory to the new player.
		mobj->ObtainInventory (oldactor);
		FBehavior::StaticStopMyScripts (oldactor);	// cancel all ENTER/RESPAWN scripts for the voodoo doll
	}

	// [GRB] Reset skin
	p->userinfo.SkinNumChanged(R_FindSkin (skins[p->userinfo.GetSkin()].name, p->CurrentPlayerClass));

	if (!(mobj->flags2 & MF2_DONTTRANSLATE))
	{
		// [RH] Be sure the player has the right translation
		R_BuildPlayerTranslation (playernum);

		// [RH] set color translations for player sprites
		mobj->Translation = TRANSLATION(TRANSLATION_Players,playernum);
	}

	mobj->Angles.Yaw = SpawnAngle;
	mobj->Angles.Pitch = mobj->Angles.Roll = 0.;
	mobj->health = p->health;

	// [RH] Set player sprite based on skin
	if (!(mobj->flags4 & MF4_NOSKIN))
	{
		mobj->sprite = skins[p->userinfo.GetSkin()].sprite;
	}

	p->DesiredFOV = p->FOV = 90.f;
	p->camera = p->mo;
	p->playerstate = PST_LIVE;
	p->refire = 0;
	p->damagecount = 0;
	p->bonuscount = 0;
	p->morphTics = 0;
	p->MorphedPlayerClass = 0;
	p->MorphStyle = 0;
	p->MorphExitFlash = NULL;
	p->extralight = 0;
	p->fixedcolormap = NOFIXEDCOLORMAP;
	p->fixedlightlevel = -1;
	p->viewheight = mobj->ViewHeight;
	p->inconsistant = 0;
	p->attacker = NULL;
	p->spreecount = 0;
	p->multicount = 0;
	p->lastkilltime = 0;
	p->BlendR = p->BlendG = p->BlendB = p->BlendA = 0.f;
	p->mo->ResetAirSupply(false);
	p->Uncrouch();
	p->MinPitch = p->MaxPitch = 0.;	// will be filled in by PostBeginPlay()/netcode
	p->MUSINFOactor = NULL;
	p->MUSINFOtics = -1;

	p->Vel.Zero();	// killough 10/98: initialize bobbing to 0.

	for (int ii = 0; ii < MAXPLAYERS; ++ii)
	{
		if (playeringame[ii] && players[ii].camera == oldactor)
		{
			players[ii].camera = mobj;
		}
	}

	// [RH] Allow chasecam for demo watching
	if ((demoplayback || demonew) && chasedemo)
		p->cheats = CF_CHASECAM;

	// setup gun psprite
	if (!(flags & SPF_TEMPPLAYER))
	{ // This can also start a script so don't do it for the dummy player.
		P_SetupPsprites (p, !!(flags & SPF_WEAPONFULLYUP));
	}

	if (deathmatch)
	{ // Give all cards in death match mode.
		p->mo->GiveDeathmatchInventory ();
	}
	else if ((multiplayer || (level.flags2 & LEVEL2_ALLOWRESPAWN) || sv_singleplayerrespawn) && state == PST_REBORN && oldactor != NULL)
	{ // Special inventory handling for respawning in coop
		p->mo->FilterCoopRespawnInventory (oldactor);
	}
	if (oldactor != NULL)
	{ // Remove any inventory left from the old actor. Coop handles
	  // it above, but the other modes don't.
		oldactor->DestroyAllInventory();
	}
	// [BC] Handle temporary invulnerability when respawned
	if ((state == PST_REBORN || state == PST_ENTER) &&
		(dmflags2 & DF2_YES_RESPAWN_INVUL) &&
		(multiplayer || alwaysapplydmflags))
	{
		APowerup *invul = static_cast<APowerup*>(p->mo->GiveInventoryType (RUNTIME_CLASS(APowerInvulnerable)));
		invul->EffectTics = 3*TICRATE;
		invul->BlendColor = 0;			// don't mess with the view
		invul->ItemFlags |= IF_UNDROPPABLE;	// Don't drop this
		p->mo->effects |= FX_RESPAWNINVUL;	// [RH] special effect
	}

	if (StatusBar != NULL && (playernum == consoleplayer || StatusBar->GetPlayer() == playernum))
	{
		StatusBar->AttachToPlayer (p);
	}

	if (multiplayer)
	{
		P_SpawnTeleportFog(mobj, mobj->Vec3Angle(20., mobj->Angles.Yaw, 0.), false, true);
	}

	// "Fix" for one of the starts on exec.wad MAP01: If you start inside the ceiling,
	// drop down below it, even if that means sinking into the floor.
	if (mobj->Top() > mobj->ceilingz)
	{
		mobj->SetZ(mobj->ceilingz - mobj->Height, false);
	}

	// [BC] Do script stuff
	if (!(flags & SPF_TEMPPLAYER))
	{
		if (state == PST_ENTER || (state == PST_LIVE && !savegamerestore))
		{
			FBehavior::StaticStartTypedScripts (SCRIPT_Enter, p->mo, true);
		}
		else if (state == PST_REBORN)
		{
			assert (oldactor != NULL);

			// before relocating all pointers to the player all sound targets
			// pointing to the old actor have to be NULLed. Otherwise all
			// monsters who last targeted this player will wake up immediately
			// after the player has respawned.
			AActor *th;
			TThinkerIterator<AActor> it;
			while ((th = it.Next()))
			{
				if (th->LastHeard == oldactor) th->LastHeard = NULL;
			}
			for(int i = 0; i < numsectors; i++)
			{
				if (sectors[i].SoundTarget == oldactor) sectors[i].SoundTarget = NULL;
			}

			DObject::StaticPointerSubstitution (oldactor, p->mo);
			// PointerSubstitution() will also affect the bodyque, so undo that now.
			for (int ii=0; ii < BODYQUESIZE; ++ii)
				if (bodyque[ii] == p->mo)
					bodyque[ii] = oldactor;
			FBehavior::StaticStartTypedScripts (SCRIPT_Respawn, p->mo, true);
		}
	}
	return mobj;
}